

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

bool __thiscall bigint<13>::operator<(bigint<13> *this,bigint<1> *y)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  
  uVar2 = this->len;
  uVar6 = (ulong)uVar2;
  uVar8 = y->len;
  bVar4 = true;
  if ((int)uVar8 <= (int)uVar2) {
    if ((int)uVar2 <= (int)uVar8) {
      do {
        bVar7 = (byte)uVar8;
        iVar5 = (int)uVar6;
        if (iVar5 < 1) goto LAB_00156947;
        uVar1 = this->digits[uVar6 - 1];
        uVar8 = (uint)uVar1;
        lVar3 = uVar6 - 1;
        if (uVar1 < y->digits[lVar3]) {
          bVar7 = 1;
          goto LAB_00156947;
        }
        uVar6 = uVar6 - 1;
      } while (uVar1 <= y->digits[lVar3]);
      bVar7 = 0;
LAB_00156947:
      return (bool)(0 < iVar5 & bVar7);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator<(const bigint<Y_DIGITS> &y) const
    {
        if(len<y.len) return true;
        if(len>y.len) return false;
        for(int i = len-1; i>=0; i--)
        {
            if(digits[i]<y.digits[i]) return true;
            if(digits[i]>y.digits[i]) return false;
        }
        return false;
    }